

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O2

int __thiscall
cppqc::Generator<std::tuple<int>_>::GenModel<cppqc::detail::TupleGenerator<int>_>::clone
          (GenModel<cppqc::detail::TupleGenerator<int>_> *this,__fn *__fn,void *__child_stack,
          int __flags,void *__arg,...)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 uVar3;
  
  puVar1 = (undefined8 *)operator_new(0x10);
  plVar2 = (long *)(**(code **)(*(long *)(this->m_obj).m_gen.
                                         super__Tuple_impl<0UL,_cppqc::Generator<int>_>.
                                         super__Head_base<0UL,_cppqc::Generator<int>,_false>.
                                         _M_head_impl.m_gen._M_t.
                                         super___uniq_ptr_impl<cppqc::detail::GenConcept<int>,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
                               + 0x20))();
  *puVar1 = &PTR__GenModel_0010dd50;
  uVar3 = (**(code **)(*plVar2 + 0x20))(plVar2);
  puVar1[1] = uVar3;
  (**(code **)(*plVar2 + 8))(plVar2);
  return (int)puVar1;
}

Assistant:

detail::GenConcept<T>* clone() const override {
      return new GenModel(m_obj);
    }